

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O3

bool __thiscall
spvtools::opt::InvocationInterlockPlacementPass::extractInstructionsFromCalls
          (InvocationInterlockPlacementPass *this,
          vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *blocks)

{
  pointer ppBVar1;
  BasicBlock *pBVar2;
  char cVar3;
  Instruction *pIVar4;
  Instruction *pIVar5;
  pointer ppBVar6;
  bool modified;
  byte local_81;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> local_80;
  InvocationInterlockPlacementPass *local_78;
  _Any_data *local_70;
  undefined8 local_68;
  code *local_60;
  code *local_58;
  _Any_data local_50;
  code *local_40;
  code *local_38;
  
  local_81 = 0;
  ppBVar6 = (blocks->
            super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  ppBVar1 = (blocks->
            super__Vector_base<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppBVar6 == ppBVar1) {
    local_81 = 0;
  }
  else {
    local_78 = this;
    do {
      pBVar2 = *ppBVar6;
      local_50._M_unused._M_object = local_78;
      local_50._8_8_ = &local_81;
      local_38 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:194:24)>
                 ::_M_invoke;
      local_40 = std::
                 _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:194:24)>
                 ::_M_manager;
      local_68 = 0;
      local_58 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
                 ::_M_invoke;
      local_60 = std::
                 _Function_handler<bool_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h:295:7)>
                 ::_M_manager;
      pIVar4 = (pBVar2->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      local_70 = &local_50;
      if (pIVar4 != (Instruction *)0x0) {
        local_80._M_head_impl = pIVar4;
        std::
        _Function_handler<void_(spvtools::opt::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp:194:24)>
        ::_M_invoke(&local_50,&local_80._M_head_impl);
      }
      pIVar4 = (pBVar2->insts_).super_IntrusiveList<spvtools::opt::Instruction>.sentinel_.
               super_IntrusiveNodeBase<spvtools::opt::Instruction>.next_node_;
      if ((pIVar4 != (Instruction *)0x0) &&
         ((pIVar4->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ == false)) {
        do {
          if (pIVar4 == (Instruction *)0x0) break;
          pIVar5 = (pIVar4->super_IntrusiveNodeBase<spvtools::opt::Instruction>).next_node_;
          local_80._M_head_impl = pIVar4;
          if (local_60 == (code *)0x0) {
            std::__throw_bad_function_call();
          }
          if ((pIVar5->super_IntrusiveNodeBase<spvtools::opt::Instruction>).is_sentinel_ != false) {
            pIVar5 = (Instruction *)0x0;
          }
          cVar3 = (*local_58)(&local_70,&local_80);
          pIVar4 = pIVar5;
        } while (cVar3 != '\0');
      }
      if (local_60 != (code *)0x0) {
        (*local_60)(&local_70,&local_70,3);
      }
      if (local_40 != (code *)0x0) {
        (*local_40)(&local_50,&local_50,3);
      }
      ppBVar6 = ppBVar6 + 1;
    } while (ppBVar6 != ppBVar1);
  }
  return (bool)(local_81 & 1);
}

Assistant:

bool InvocationInterlockPlacementPass::extractInstructionsFromCalls(
    std::vector<BasicBlock*> blocks) {
  bool modified = false;

  for (BasicBlock* block : blocks) {
    block->ForEachInst([this, &modified](Instruction* inst) {
      if (inst->opcode() == spv::Op::OpFunctionCall) {
        uint32_t function_id =
            inst->GetSingleWordInOperand(kFunctionCallFunctionIdInIdx);
        Function* func = context()->GetFunction(function_id);
        ExtractionResult result = extracted_functions_[func];

        if (result.had_begin) {
          Instruction* new_inst = new Instruction(
              context(), spv::Op::OpBeginInvocationInterlockEXT);
          new_inst->InsertBefore(inst);
          modified = true;
        }
        if (result.had_end) {
          Instruction* new_inst =
              new Instruction(context(), spv::Op::OpEndInvocationInterlockEXT);
          new_inst->InsertAfter(inst);
          modified = true;
        }
      }
    });
  }
  return modified;
}